

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_28a10::MapWriter::MapWriter(MapWriter *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MapWriter_001860d0;
  (this->bytes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bytes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bytes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->writer_).super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
  policy_.bytes_ = &this->bytes_;
  (this->writer_).super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
  bytes_consumed_ = 0;
  (this->writer_).super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
  flushed_ = false;
  (this->writer_).super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
  _vptr_writer_base = (_func_int **)&PTR__vector_writer_00189c40;
  return;
}

Assistant:

MapWriter ()
                : writer_ (bytes_) {}